

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_file_system.cpp
# Opt level: O1

BufferHandle * __thiscall
duckdb::CachingFileHandle::TryInsertFileRange
          (BufferHandle *__return_storage_ptr__,CachingFileHandle *this,BufferHandle *pin,
          data_ptr_t *buffer,idx_t nr_bytes,idx_t location,
          shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> *new_file_range)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *this_00;
  CachedFile *pCVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  ulong uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  BufferHandle *this_02;
  bool bVar8;
  int iVar9;
  CachedFileRange *pCVar10;
  type pCVar11;
  const_iterator cVar12;
  ulong uVar13;
  mapped_type *pmVar14;
  char cVar15;
  ulong uVar16;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> *guard_00;
  const_iterator __position;
  map<unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>_>
  *this_03;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> guard;
  idx_t local_78;
  BufferHandle *local_70;
  BufferHandle *local_68;
  element_type *local_60;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined8 local_50;
  BufferHandle local_48;
  
  local_78 = location;
  local_70 = __return_storage_ptr__;
  local_68 = pin;
  local_50 = buffer;
  shared_ptr<duckdb::StorageLockInternals,_true>::operator->(&(this->cached_file->lock).internals);
  StorageLockInternals::GetExclusiveLock((StorageLockInternals *)&local_60);
  pCVar2 = this->cached_file;
  p_Var1 = &(pCVar2->ranges)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (pCVar2->ranges)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  __position._M_node = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < local_78]) {
    if (*(ulong *)(p_Var3 + 1) >= local_78) {
      __position._M_node = p_Var3;
    }
  }
  this_03 = &pCVar2->ranges;
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    do {
      this_00 = &__position._M_node[1]._M_parent;
      pCVar10 = shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator->
                          ((shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> *)this_00);
      pCVar11 = shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator*
                          (new_file_range);
      if ((pCVar11->location < pCVar10->location) ||
         (pCVar10->location + pCVar10->nr_bytes < pCVar11->location + pCVar11->nr_bytes)) {
        pCVar10 = shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator->
                            (new_file_range);
        pCVar11 = shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator*
                            ((shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> *)this_00
                            );
        uVar4 = pCVar11->location;
        uVar5 = pCVar10->location;
        uVar16 = pCVar10->nr_bytes + uVar5;
        uVar13 = pCVar11->nr_bytes + uVar4;
        bVar8 = uVar4 < uVar16 && uVar5 < uVar13;
        iVar9 = 2;
        cVar15 = '\x02';
        if (uVar16 < uVar13) {
          cVar15 = bVar8;
        }
        if (uVar4 < uVar5) {
          cVar15 = bVar8;
        }
        cVar12._M_node = __position._M_node;
        if (cVar15 != '\0') {
          if (cVar15 == '\x02') {
            cVar12._M_node = (_Base_ptr)::std::_Rb_tree_increment(__position._M_node);
            ::std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>_>
            ::_M_erase_aux(&this_03->_M_t,__position);
            iVar9 = 3;
          }
          else {
            cVar12._M_node = (_Base_ptr)::std::_Rb_tree_increment(__position._M_node);
            iVar9 = 0;
          }
        }
        if ((iVar9 != 0) && (iVar9 != 3)) goto LAB_017dc42c;
      }
      else {
        pCVar11 = shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator*
                            ((shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> *)this_00
                            );
        TryReadFromFileRange
                  (&local_48,(CachingFileHandle *)local_58._M_pi,guard_00,pCVar11,
                   (data_ptr_t *)local_50,location,local_78);
        this_02 = local_68;
        BufferHandle::operator=(local_68,&local_48);
        BufferHandle::~BufferHandle(&local_48);
        bVar8 = BufferHandle::IsValid(this_02);
        if (bVar8) goto LAB_017dc46d;
        cVar12._M_node = (_Base_ptr)::std::_Rb_tree_increment(__position._M_node);
        ::std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>_>
        ::_M_erase_aux(&this_03->_M_t,__position);
      }
      __position._M_node = cVar12._M_node;
    } while ((_Rb_tree_header *)cVar12._M_node != p_Var1);
    iVar9 = 2;
LAB_017dc42c:
    if (iVar9 != 2) goto LAB_017dc47c;
  }
  shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator->(new_file_range);
  pmVar14 = ::std::
            map<unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>_>
            ::operator[](this_03,&local_78);
  peVar6 = (new_file_range->internal).
           super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var7 = (new_file_range->internal).
           super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (new_file_range->internal).
  super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (new_file_range->internal).
  super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (pmVar14->internal).
            super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (pmVar14->internal).
  super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar6;
  (pmVar14->internal).
  super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var7;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
LAB_017dc46d:
  BufferHandle::BufferHandle(local_70,local_68);
LAB_017dc47c:
  if (local_60 != (element_type *)0x0) {
    StorageLockKey::~StorageLockKey((StorageLockKey *)local_60);
    operator_delete(local_60);
  }
  return local_70;
}

Assistant:

BufferHandle CachingFileHandle::TryInsertFileRange(BufferHandle &pin, data_ptr_t &buffer, idx_t nr_bytes,
                                                   idx_t location, shared_ptr<CachedFileRange> &new_file_range) {
	// Grab the lock again (write lock this time) to insert the newly created buffer into the ranges
	auto guard = cached_file.lock.GetExclusiveLock();
	auto &ranges = cached_file.Ranges(guard);

	// Start at lower_bound (first range with location not less than location of newly created range)
	for (auto it = ranges.lower_bound(location); it != ranges.end();) {
		if (it->second->GetOverlap(*new_file_range) == CachedFileRangeOverlap::FULL) {
			// Another thread has read a range that fully contains the requested range in the meantime
			pin = TryReadFromFileRange(guard, *it->second, buffer, nr_bytes, location);
			if (pin.IsValid()) {
				return std::move(pin);
			}
			it = ranges.erase(it);
			continue;
		}
		// Check if the new range overlaps with a cached one
		bool break_loop = false;
		switch (new_file_range->GetOverlap(*it->second)) {
		case CachedFileRangeOverlap::NONE:
			break_loop = true; // We iterated past potential overlaps
			break;
		case CachedFileRangeOverlap::PARTIAL:
			break; // The newly created range does not fully contain this range, so it is still useful
		case CachedFileRangeOverlap::FULL:
			// Full overlap, this range will be obsolete when we insert the current one
			// Since we have the write lock here, we can do some cleanup
			it = ranges.erase(it);
			continue;
		}
		if (break_loop) {
			break;
		}
		++it;
	}

	// Finally, insert newly created buffer into the map
	new_file_range->AddCheckSum();
	ranges[location] = std::move(new_file_range);
	cached_file.Verify(guard);

	return std::move(pin);
}